

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O0

int demo1(void)

{
  allocator<unsigned_char> *this;
  uchar outchar;
  uint uVar1;
  uchar *puVar2;
  ostream *poVar3;
  void *pvVar4;
  runtime_error *prVar5;
  allocator<unsigned_char> local_4c9;
  uint32_t trueanswer;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b8;
  undefined1 local_4b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvect;
  uint32_t trueanswerslice;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_488;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  undefined1 local_470 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvectslice;
  allocator local_441;
  string local_440 [8];
  string input;
  undefined1 local_420 [8];
  CyclicHash<unsigned_int,_unsigned_char> hf;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_420,3,0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"ABCD",&local_441);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_440);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_420,*puVar2);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_440);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_420,*puVar2);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_440);
  CyclicHash<unsigned_int,_unsigned_char>::eat
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_420,*puVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Hash value of BCD is ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_420._0_4_);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_480._M_current = (char *)std::__cxx11::string::begin();
  local_478 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&local_480,1);
  _trueanswerslice = (char *)std::__cxx11::string::begin();
  local_488 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&trueanswerslice,4);
  this = (allocator<unsigned_char> *)
         ((long)&charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_470,local_478,local_488,
             this);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       CyclicHash<unsigned_int,unsigned_char>::
       hash<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                 ((CyclicHash<unsigned_int,unsigned_char> *)local_420,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_470);
  if ((uint)charvect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != local_420._0_4_) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"bug");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_440);
  outchar = *puVar2;
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_440);
  CyclicHash<unsigned_int,_unsigned_char>::reverse_update
            ((CyclicHash<unsigned_int,_unsigned_char> *)local_420,outchar,*puVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Hash value of ABC is ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_420._0_4_);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_4b8._M_current = (char *)std::__cxx11::string::begin();
  _trueanswer = (char *)std::__cxx11::string::begin();
  local_4c0 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&trueanswer,3);
  std::allocator<unsigned_char>::allocator(&local_4c9);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4b0,local_4b8,local_4c0,
             &local_4c9);
  std::allocator<unsigned_char>::~allocator(&local_4c9);
  uVar1 = CyclicHash<unsigned_int,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                    ((CyclicHash<unsigned_int,unsigned_char> *)local_420,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4b0);
  if (uVar1 != local_420._0_4_) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"bug");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_470);
  std::__cxx11::string::~string(local_440);
  return 0;
}

Assistant:

int demo1() {
  CyclicHash<> hf(3, 32);
  string input = "ABCD";
  hf.eat(input[1]); // B
  hf.eat(input[2]); // C
  hf.eat(input[3]); // D
  cout << "Hash value of BCD is " << hf.hashvalue << endl;
  // we check the answer going the long way...
  const std::vector<unsigned char> charvectslice(input.begin() + 1,
                                                 input.begin() + 4);
  uint32_t trueanswerslice = hf.hash(charvectslice);
  if (trueanswerslice != hf.hashvalue)
    throw runtime_error("bug");
  // we continue
  hf.reverse_update(input[0], input[3]); // remove D, prepend A
  cout << "Hash value of ABC is " << hf.hashvalue << endl;
  // we check the answer going the long way
  const std::vector<unsigned char> charvect(input.begin(), input.begin() + 3);
  uint32_t trueanswer = hf.hash(charvect);
  if (trueanswer != hf.hashvalue)
    throw runtime_error("bug");
  return 0;
}